

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_short>
          (IntDigits *this,unsigned_short v)

{
  undefined2 uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ushort uVar5;
  
  pcVar3 = &this->field_0x3d;
  uVar4 = (ulong)v;
  do {
    pcVar2 = pcVar3;
    uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (uVar4 & 0xff) * 2);
    *(undefined2 *)(pcVar2 + -3) = uVar1;
    uVar5 = (ushort)uVar4;
    pcVar3 = pcVar2 + -2;
    uVar4 = uVar4 >> 8;
  } while (0xff < uVar5);
  pcVar3 = pcVar2 + -3;
  if ((char)uVar1 == '0') {
    pcVar3 = pcVar2 + -2;
  }
  this->start_ = pcVar3;
  this->size_ = (long)this + (0x3c - (long)pcVar3);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }